

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_uses_schema_nodeid(char *nodeid,lys_node *start,lys_node_grp **ret)

{
  uint uVar1;
  lys_module *plVar2;
  lys_module *plVar3;
  lys_node_grp *plVar4;
  int iVar5;
  int local_3c;
  char *pcStack_38;
  int nam_len;
  char *mod_prefix;
  char *name;
  int mod_prefix_len;
  
  uVar1 = parse_node_identifier
                    (nodeid,&stack0xffffffffffffffc8,(int *)((long)&name + 4),&mod_prefix,&local_3c)
  ;
  if (((int)uVar1 < 1) || (nodeid[uVar1] != '\0')) {
    iVar5 = 1 - uVar1;
  }
  else {
    plVar2 = lys_get_import_module(start->module,pcStack_38,name._4_4_,(char *)0x0,0);
    if (plVar2 == (lys_module *)0x0) {
      iVar5 = -1;
    }
    else {
      plVar3 = lys_main_module(start->module);
      if (plVar2 != plVar3) {
        start = plVar2->data;
      }
      plVar4 = lys_find_grouping_up(mod_prefix,start);
      *ret = plVar4;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int
resolve_uses_schema_nodeid(const char *nodeid, const struct lys_node *start, const struct lys_node_grp **ret)
{
    const struct lys_module *module;
    const char *mod_prefix, *name;
    int i, mod_prefix_len, nam_len;

    /* parse the identifier, it must be parsed on one call */
    if (((i = parse_node_identifier(nodeid, &mod_prefix, &mod_prefix_len, &name, &nam_len)) < 1) || nodeid[i]) {
        return -i + 1;
    }

    module = lys_get_import_module(start->module, mod_prefix, mod_prefix_len, NULL, 0);
    if (!module) {
        return -1;
    }
    if (module != lys_main_module(start->module)) {
        start = module->data;
    }

    *ret = lys_find_grouping_up(name, (struct lys_node *)start);

    return EXIT_SUCCESS;
}